

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_graph.h
# Opt level: O0

void __thiscall PP_point::~PP_point(PP_point *this)

{
  PP_point *this_local;
  
  this->_vptr_PP_point = (_func_int **)&PTR__PP_point_00125c18;
  std::vector<PP_edge,_std::allocator<PP_edge>_>::clear(&this->e);
  std::vector<PP_edge,_std::allocator<PP_edge>_>::~vector(&this->e);
  return;
}

Assistant:

virtual ~PP_point()
    {
        e.clear();
    }